

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::setup(HFactor *this,HighsSparseMatrix *a_matrix,
              vector<int,_std::allocator<int>_> *basic_index,double pivot_threshold,
              double pivot_tolerance,HighsInt highs_debug_level,HighsLogOptions *log_options)

{
  HighsInt *basic_index_00;
  HighsInt num_basic;
  
  basic_index_00 =
       (basic_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  num_basic = (HighsInt)
              ((ulong)((long)(basic_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)basic_index_00) >> 2);
  if (0 < num_basic) {
    setupGeneral(this,a_matrix,num_basic,basic_index_00,pivot_threshold,pivot_tolerance,
                 highs_debug_level,log_options);
    return;
  }
  return;
}

Assistant:

void HFactor::setup(const HighsSparseMatrix& a_matrix,
                    std::vector<HighsInt>& basic_index,
                    const double pivot_threshold, const double pivot_tolerance,
                    const HighsInt highs_debug_level,
                    const HighsLogOptions* log_options) {
  HighsInt basic_index_size = basic_index.size();
  // Nothing to do if basic index has no entries, and mustn't try to
  // pass the pointer to entry 0 of a vector of size 0.
  if (basic_index_size <= 0) return;
  this->setupGeneral(&a_matrix, basic_index_size, basic_index.data(),
                     pivot_threshold, pivot_tolerance, highs_debug_level,
                     log_options);
  return;
}